

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O0

void __thiscall
CLineInput::DrawSelection(CLineInput *this,float HeightWeight,int Start,int End,vec4 Color)

{
  uint uVar1;
  int iVar2;
  uint in_EDX;
  uint in_ESI;
  CTextCursor *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  float MiddleSegmentHeight;
  float SecondSegmentY;
  int NumQuads;
  float VAlignOffset;
  float LineHeight;
  vec2 EndPos;
  vec2 StartPos;
  int VAlign;
  CQuadItem SelectionQuad;
  CTextBoundingBox BoundingBox;
  CQuadItem aSelectionQuads [3];
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  CTextCursor *in_stack_fffffffffffffef0;
  CQuadItem *local_100;
  float local_f8;
  float local_f4;
  uint local_dc;
  float local_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  CQuadItem local_a8;
  CQuadItem local_98;
  CQuadItem local_88;
  CQuadItem local_78;
  CQuadItem local_68;
  CTextBoundingBox local_58 [2];
  CQuadItem local_38;
  CQuadItem CStack_28;
  CQuadItem CStack_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = in_RDI->m_Align & 0xc;
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,in_RDI,(ulong)in_ESI);
  (*(s_pTextRender->super_IInterface)._vptr_IInterface[0x13])(s_pTextRender,in_RDI,(ulong)in_EDX);
  fVar3 = CTextCursor::BaseLineY(in_RDI);
  iVar2 = CTextCursor::LineCount(in_RDI);
  fVar3 = fVar3 / (float)iVar2;
  if (uVar1 == 0) {
    local_f4 = -fVar3 * (1.0 - in_XMM0_Da) + -1.0;
  }
  else {
    if (uVar1 == 4) {
      local_f8 = -fVar3 * (1.0 - in_XMM0_Da) + fVar3 / 2.0;
    }
    else {
      local_f8 = fVar3 * (in_XMM0_Da + 0.35000002) + -1.0;
    }
    local_f4 = local_f8;
  }
  IGraphics::TextureClear((IGraphics *)in_stack_fffffffffffffef0);
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  IGraphics::SetColor((IGraphics *)in_stack_fffffffffffffef0,
                      (vec4 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  fStack_c4 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  fStack_cc = (float)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  local_c8 = (float)extraout_XMM0_Qa;
  local_d0 = (float)extraout_XMM0_Qa_00;
  if (fStack_cc <= fStack_c4) {
    IGraphics::CQuadItem::CQuadItem
              (&local_a8,local_c8,fStack_c4 - local_f4,local_d0 - local_c8,fVar3 * in_XMM0_Da);
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_a8,1);
  }
  else {
    local_58[0] = CTextCursor::BoundingBox(in_stack_fffffffffffffef0);
    local_100 = &local_38;
    do {
      IGraphics::CQuadItem::CQuadItem(local_100);
      local_100 = local_100 + 1;
    } while (local_100 != (CQuadItem *)&stack0xfffffffffffffff8);
    fVar4 = fStack_c4 - local_f4;
    fVar6 = local_c8;
    fVar5 = CTextBoundingBox::Right(local_58);
    IGraphics::CQuadItem::CQuadItem(&local_68,fVar6,fVar4,fVar5 - local_c8,fVar3 * in_XMM0_Da);
    local_38.m_X = local_68.m_X;
    local_38.m_Y = local_68.m_Y;
    local_38.m_Width = local_68.m_Width;
    local_38.m_Height = local_68.m_Height;
    fVar6 = (fStack_c4 - local_f4) + fVar3;
    if (fStack_cc - fStack_c4 <= fVar3) {
      IGraphics::CQuadItem::CQuadItem
                (&local_98,local_58[0].x,fVar6,local_d0 - local_58[0].x,fVar3 * in_XMM0_Da);
      local_dc = 2;
      CStack_28.m_X = local_98.m_X;
      CStack_28.m_Y = local_98.m_Y;
      CStack_28.m_Width = local_98.m_Width;
      CStack_28.m_Height = local_98.m_Height;
    }
    else {
      fVar4 = (fStack_cc - fStack_c4) - fVar3;
      IGraphics::CQuadItem::CQuadItem(&local_78,local_58[0].x,fVar6,local_58[0].w,fVar4);
      CStack_28.m_X = local_78.m_X;
      CStack_28.m_Y = local_78.m_Y;
      CStack_28.m_Width = local_78.m_Width;
      CStack_28.m_Height = local_78.m_Height;
      IGraphics::CQuadItem::CQuadItem
                (&local_88,local_58[0].x,fVar6 + fVar4,local_d0 - local_58[0].x,fVar3 * in_XMM0_Da);
      local_dc = 3;
      CStack_18.m_X = local_88.m_X;
      CStack_18.m_Y = local_88.m_Y;
      CStack_18.m_Width = local_88.m_Width;
      CStack_18.m_Height = local_88.m_Height;
    }
    (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x1d])(s_pGraphics,&local_38,(ulong)local_dc)
    ;
  }
  (*(s_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLineInput::DrawSelection(float HeightWeight, int Start, int End, vec4 Color)
{
	const int VAlign = m_TextCursor.m_Align&TEXTALIGN_MASK_VERT;

	const vec2 StartPos = s_pTextRender->CaretPosition(&m_TextCursor, Start);
	const vec2 EndPos = s_pTextRender->CaretPosition(&m_TextCursor, End);
	const float LineHeight = m_TextCursor.BaseLineY()/m_TextCursor.LineCount();
	const float VAlignOffset =
		(VAlign == TEXTALIGN_TOP) ? -LineHeight*(1.0f-HeightWeight)-1.0f :
		(VAlign == TEXTALIGN_MIDDLE) ? -LineHeight*(1.0f-HeightWeight)+LineHeight/2 :
		/* TEXTALIGN_BOTTOM */ LineHeight*(1.35f-1.0f+HeightWeight)-1.0f;
	s_pGraphics->TextureClear();
	s_pGraphics->QuadsBegin();
	s_pGraphics->SetColor(Color);
	if(StartPos.y < EndPos.y) // multi line selection
	{
		CTextBoundingBox BoundingBox = m_TextCursor.BoundingBox();
		int NumQuads = 0;
		IGraphics::CQuadItem aSelectionQuads[3];
		aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(StartPos.x, StartPos.y - VAlignOffset, BoundingBox.Right() - StartPos.x, LineHeight*HeightWeight);
		const float SecondSegmentY = StartPos.y - VAlignOffset + LineHeight;
		if(EndPos.y - StartPos.y > LineHeight)
		{
			const float MiddleSegmentHeight = EndPos.y - StartPos.y - LineHeight;
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, BoundingBox.w, MiddleSegmentHeight);
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY + MiddleSegmentHeight, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		}
		else
			aSelectionQuads[NumQuads++] = IGraphics::CQuadItem(BoundingBox.x, SecondSegmentY, EndPos.x - BoundingBox.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(aSelectionQuads, NumQuads);
	}
	else // single line selection
	{
		IGraphics::CQuadItem SelectionQuad(StartPos.x, StartPos.y - VAlignOffset, EndPos.x - StartPos.x, LineHeight*HeightWeight);
		s_pGraphics->QuadsDrawTL(&SelectionQuad, 1);
	}
	s_pGraphics->QuadsEnd();
}